

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

bool units::segmentcheckReverse(string *unit,char closeSegment,int *index)

{
  byte mchar;
  int iVar1;
  pointer pcVar2;
  bool bVar3;
  char closeSegment_00;
  bool bVar4;
  byte bVar5;
  byte unaff_R15B;
  
  if (*index < (int)unit->_M_string_length) {
    do {
      iVar1 = *index;
      if ((long)iVar1 < 0) {
        bVar5 = 0;
        break;
      }
      pcVar2 = (unit->_M_dataplus)._M_p;
      mchar = pcVar2[iVar1];
      *index = iVar1 - 1U;
      if ((iVar1 == 0) || (pcVar2[iVar1 - 1U] != '\\')) {
        bVar3 = true;
        if (mchar == closeSegment) {
          bVar5 = 1;
        }
        else {
          bVar5 = 0;
          if (mchar < 0x5d) {
            bVar5 = 0;
            if (mchar != 0x28) {
              if (mchar == 0x29) goto LAB_00189ccc;
              if (mchar != 0x5b) goto LAB_00189ce6;
            }
          }
          else {
            if (mchar != 0x7d) {
              if (mchar == 0x7b) goto LAB_00189cec;
              if (mchar != 0x5d) goto LAB_00189ce6;
            }
LAB_00189ccc:
            closeSegment_00 = getMatchCharacter(mchar);
            bVar4 = segmentcheckReverse(unit,closeSegment_00,index);
            if (bVar4) goto LAB_00189ce6;
            bVar5 = 0;
          }
        }
      }
      else {
        *index = iVar1 + -2;
LAB_00189ce6:
        bVar3 = false;
        bVar5 = unaff_R15B;
      }
LAB_00189cec:
      unaff_R15B = bVar5;
    } while (!bVar3);
  }
  else {
    bVar5 = 0;
  }
  return (bool)(bVar5 & 1);
}

Assistant:

static bool
    segmentcheckReverse(const std::string& unit, char closeSegment, int& index)
{
    if (index >= static_cast<int>(unit.size())) {
        // LCOV_EXCL_START
        return false;
        // LCOV_EXCL_STOP
    }
    while (index >= 0) {
        char current = unit[index];
        --index;
        if (index >= 0 && unit[index] == '\\') {
            --index;
            continue;
        }
        if (current == closeSegment) {
            return true;
        }
        switch (current) {
            case '}':
            case ')':
            case ']':
                if (!segmentcheckReverse(
                        unit, getMatchCharacter(current), index)) {
                    // LCOV_EXCL_START
                    return false;
                    // LCOV_EXCL_STOP
                }
                break;
            case '{':
            case '(':
            case '[':
                return false;
            default:
                break;
        }
    }
    // LCOV_EXCL_START
    return false;
    // LCOV_EXCL_STOP
}